

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.c
# Opt level: O0

Symbol * dyn_ext_entry(GlobalVars *gv,Symbol *xdef,Reloc *xref,int entrytype)

{
  Symbol *pSVar1;
  int in_ECX;
  long in_RDX;
  Symbol *in_RSI;
  Symbol *sym;
  DynArg a;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  DynArg in_stack_ffffffffffffffc8;
  
  if ((in_RSI->relsect->obj->lnkfile->type == '\x04') || (in_ECX != 2)) {
    pSVar1 = dyn_entry((GlobalVars *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffc8,in_stack_ffffffffffffffbc);
    if (pSVar1 != (Symbol *)0x0) {
      return pSVar1;
    }
  }
  else if (*(char *)(in_RDX + 0x38) == '\a') {
    *(undefined1 *)(in_RDX + 0x38) = 1;
  }
  else if (*(char *)(in_RDX + 0x38) == '\b') {
    *(undefined1 *)(in_RDX + 0x38) = 2;
  }
  return in_RSI;
}

Assistant:

static struct Symbol *dyn_ext_entry(struct GlobalVars *gv,
                                    struct Symbol *xdef,struct Reloc *xref,
                                    int entrytype)
/* make a dyn_entry for an external reference */
{
  if (xdef->relsect->obj->lnkfile->type!=ID_SHAREDOBJ
      && entrytype==PLT_ENTRY) {
    /* resolve PLT relocation to a local function directly */
    switch (xref->rtype) {
      case R_PLT:
        xref->rtype = R_ABS;
        break;
      case R_PLTPC:
        xref->rtype = R_PC;
        break;
    }
  }
  else {
    DynArg a;
    struct Symbol *sym;

    a.sym = xdef;
    sym = dyn_entry(gv,a,entrytype);
    if (sym)
      return sym;
  }
  return xdef;
}